

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

char * cert_expr_expression(CertExprBuilder *eb)

{
  strbuf *buf_o;
  char *pcVar1;
  ptrlen pVar2;
  ulong local_20;
  size_t i;
  strbuf *sb;
  CertExprBuilder *eb_local;
  
  buf_o = strbuf_new();
  for (local_20 = 0; local_20 < eb->nwcs; local_20 = local_20 + 1) {
    if (local_20 != 0) {
      pVar2 = ptrlen_from_asciz(" || ");
      BinarySink_put_datapl(buf_o->binarysink_,pVar2);
    }
    pVar2 = ptrlen_from_asciz(eb->wcs[local_20]);
    BinarySink_put_datapl(buf_o->binarysink_,pVar2);
  }
  pcVar1 = strbuf_to_str(buf_o);
  return pcVar1;
}

Assistant:

char *cert_expr_expression(CertExprBuilder *eb)
{
    strbuf *sb = strbuf_new();
    for (size_t i = 0; i < eb->nwcs; i++) {
        if (i)
            put_dataz(sb, " || ");
        put_dataz(sb, eb->wcs[i]);
    }
    return strbuf_to_str(sb);
}